

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O3

void TTD::NSLogEvents::RawBufferModifySync_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  EventKind EVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Var aValue;
  ArrayBuffer *pAVar5;
  undefined4 extraout_var;
  
  if (evt->EventKind != RawBufferModifySync) {
    TTDAbort_unrecoverable_error("Bad tag match!");
  }
  aValue = InflateVarInReplay(executeContext,*(TTDVar *)(evt + 1));
  bVar2 = Js::VarIs<Js::ArrayBuffer>(aValue);
  if (bVar2) {
    iVar4 = evt[2].ResultStatus;
    EVar1 = evt[2].EventKind;
    pAVar5 = Js::VarTo<Js::ArrayBuffer>(aValue);
    uVar3 = (*(pAVar5->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x71])(pAVar5);
    if (iVar4 + EVar1 <= uVar3) {
      pAVar5 = Js::VarTo<Js::ArrayBuffer>(aValue);
      iVar4 = (*(pAVar5->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])(pAVar5);
      js_memcpy_s((void *)((ulong)evt[2].EventKind + CONCAT44(extraout_var,iVar4)),
                  (ulong)(uint)evt[2].ResultStatus,(void *)evt[1].EventTimeStamp,
                  (ulong)(uint)evt[2].ResultStatus);
      return;
    }
    TTDAbort_unrecoverable_error("Copy off end of buffer!!!");
  }
  TTDAbort_unrecoverable_error("Not array buffer object!!!");
}

Assistant:

void RawBufferModifySync_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            const JsRTRawBufferModifyAction* action = GetInlineEventDataAs<JsRTRawBufferModifyAction, EventKind::RawBufferModifySync>(evt);
            Js::Var trgt = InflateVarInReplay(executeContext, action->Trgt); //never cross context

            TTDAssert(Js::VarIs<Js::ArrayBuffer>(trgt), "Not array buffer object!!!");
            TTDAssert(action->Index + action->Length <= Js::VarTo<Js::ArrayBuffer>(trgt)->GetByteLength(), "Copy off end of buffer!!!");

            byte* trgtBuff = Js::VarTo<Js::ArrayBuffer>(trgt)->GetBuffer() + action->Index;
            js_memcpy_s(trgtBuff, action->Length, action->Data, action->Length);
        }